

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_op_t *
MIR_new_mem_op(MIR_op_t *__return_storage_ptr__,MIR_context_t ctx,MIR_type_t type,MIR_disp_t disp,
              MIR_reg_t base,MIR_reg_t index,MIR_scale_t scale)

{
  MIR_reg_t index_local;
  MIR_reg_t base_local;
  MIR_disp_t disp_local;
  MIR_type_t type_local;
  MIR_context_t ctx_local;
  
  new_mem_op(__return_storage_ptr__,ctx,type,disp,base,index,scale,0,0);
  return __return_storage_ptr__;
}

Assistant:

MIR_op_t MIR_new_mem_op (MIR_context_t ctx, MIR_type_t type, MIR_disp_t disp, MIR_reg_t base,
                         MIR_reg_t index, MIR_scale_t scale) {
  return new_mem_op (ctx, type, disp, base, index, scale, 0, 0);
}